

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

float * __thiscall cimg_library::CImg<float>::max_min<float>(CImg<float> *this,float *min_val)

{
  float *pfVar1;
  float fVar2;
  bool bVar3;
  float *pfVar4;
  CImgInstanceException *this_00;
  float *ptrs;
  float *pfVar5;
  char *pcVar6;
  float fVar7;
  float fVar8;
  
  bVar3 = is_empty(this);
  if (!bVar3) {
    pfVar4 = this->_data;
    fVar7 = *pfVar4;
    pfVar1 = pfVar4 + (ulong)this->_spectrum * (ulong)this->_depth *
                      (ulong)this->_height * (ulong)this->_width;
    fVar8 = fVar7;
    for (pfVar5 = pfVar4; pfVar5 < pfVar1; pfVar5 = pfVar5 + 1) {
      fVar2 = *pfVar5;
      if (fVar8 < fVar2) {
        pfVar4 = pfVar5;
        fVar8 = fVar2;
      }
      if (fVar7 <= fVar2) {
        fVar2 = fVar7;
      }
      fVar7 = fVar2;
    }
    *min_val = fVar7;
    return pfVar4;
  }
  this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x4008);
  pcVar6 = "non-";
  if (this->_is_shared != false) {
    pcVar6 = "";
  }
  CImgInstanceException::CImgInstanceException
            (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::max_min(): Empty instance.",
             (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar6,"float");
  __cxa_throw(this_00,&CImgInstanceException::typeinfo,std::exception::~exception);
}

Assistant:

const T& max_min(t& min_val) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "max_min(): Empty instance.",
                                    cimg_instance);
      const T *ptr_max = _data;
      T max_value = *ptr_max, min_value = max_value;
      cimg_for(*this,ptrs,T) {
        const T val = *ptrs;
        if (val>max_value) { max_value = val; ptr_max = ptrs; }
        if (val<min_value) min_value = val;
      }
      min_val = (t)min_value;
      return *ptr_max;
    }